

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib503.c
# Opt level: O3

int test(char *URL)

{
  FILE *__stream;
  uint uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  undefined8 uVar6;
  char *__format;
  timeval tVar7;
  int running;
  fd_set exc;
  fd_set wr;
  fd_set rd;
  int local_1d0;
  int local_1cc;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  uVar1 = curl_global_init(3);
  if (uVar1 != 0) {
    test_cold_1();
    goto LAB_00102988;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    test_cold_15();
    uVar1 = 0x7c;
LAB_00102965:
    lVar4 = 0;
  }
  else {
    uVar1 = curl_easy_setopt(lVar3,0x2714,libtest_arg2);
    if (uVar1 != 0) {
      test_cold_2();
      goto LAB_00102965;
    }
    uVar1 = curl_easy_setopt(lVar3,0x2712,URL);
    if (uVar1 != 0) {
      test_cold_3();
      goto LAB_00102965;
    }
    uVar1 = curl_easy_setopt(lVar3,0x2715,"test:ing");
    if (uVar1 != 0) {
      test_cold_4();
      goto LAB_00102965;
    }
    uVar1 = curl_easy_setopt(lVar3,0x2716,"test:ing");
    if (uVar1 != 0) {
      test_cold_5();
      goto LAB_00102965;
    }
    uVar1 = curl_easy_setopt(lVar3,0x3d,1);
    if (uVar1 != 0) {
      test_cold_6();
      goto LAB_00102965;
    }
    uVar1 = curl_easy_setopt(lVar3,0x2a,1);
    if (uVar1 != 0) {
      test_cold_7();
      goto LAB_00102965;
    }
    uVar1 = curl_easy_setopt(lVar3,0x29,1);
    if (uVar1 != 0) {
      test_cold_8();
      goto LAB_00102965;
    }
    lVar4 = curl_multi_init();
    if (lVar4 == 0) {
      test_cold_14();
      uVar1 = 0x7b;
      goto LAB_00102965;
    }
    uVar1 = curl_multi_add_handle(lVar4,lVar3);
    if (uVar1 == 0) {
      local_1d0 = -99;
      local_1c8.tv_sec = 1;
      local_1c8.tv_usec = 0;
      uVar1 = curl_multi_perform(lVar4,&local_1cc);
      if (uVar1 == 0) {
        do {
          if (local_1cc < 0) {
            __format = 
            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
            ;
            uVar6 = 0x47;
LAB_00102a30:
            fprintf(_stderr,__format,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib503.c"
                    ,uVar6);
            uVar1 = 0x7a;
            goto LAB_00102968;
          }
          tVar7 = tutil_tvnow();
          lVar5 = tutil_tvdiff(tVar7,tv_test_start);
          if (60000 < lVar5) {
            test_cold_10();
LAB_00102a55:
            uVar1 = 0x7d;
            goto LAB_00102968;
          }
          if (local_1cc == 0) {
            uVar1 = 0;
            goto LAB_00102968;
          }
          local_b8.__fds_bits[0xe] = 0;
          local_b8.__fds_bits[0xf] = 0;
          local_b8.__fds_bits[0xc] = 0;
          local_b8.__fds_bits[0xd] = 0;
          local_b8.__fds_bits[10] = 0;
          local_b8.__fds_bits[0xb] = 0;
          local_b8.__fds_bits[8] = 0;
          local_b8.__fds_bits[9] = 0;
          local_b8.__fds_bits[6] = 0;
          local_b8.__fds_bits[7] = 0;
          local_b8.__fds_bits[4] = 0;
          local_b8.__fds_bits[5] = 0;
          local_b8.__fds_bits[2] = 0;
          local_b8.__fds_bits[3] = 0;
          local_b8.__fds_bits[0] = 0;
          local_b8.__fds_bits[1] = 0;
          local_138.__fds_bits[0] = 0;
          local_138.__fds_bits[1] = 0;
          local_138.__fds_bits[2] = 0;
          local_138.__fds_bits[3] = 0;
          local_138.__fds_bits[4] = 0;
          local_138.__fds_bits[5] = 0;
          local_138.__fds_bits[6] = 0;
          local_138.__fds_bits[7] = 0;
          local_138.__fds_bits[8] = 0;
          local_138.__fds_bits[9] = 0;
          local_138.__fds_bits[10] = 0;
          local_138.__fds_bits[0xb] = 0;
          local_138.__fds_bits[0xc] = 0;
          local_138.__fds_bits[0xd] = 0;
          local_138.__fds_bits[0xe] = 0;
          local_138.__fds_bits[0xf] = 0;
          local_1b8.__fds_bits[0] = 0;
          local_1b8.__fds_bits[1] = 0;
          local_1b8.__fds_bits[2] = 0;
          local_1b8.__fds_bits[3] = 0;
          local_1b8.__fds_bits[4] = 0;
          local_1b8.__fds_bits[5] = 0;
          local_1b8.__fds_bits[6] = 0;
          local_1b8.__fds_bits[7] = 0;
          local_1b8.__fds_bits[8] = 0;
          local_1b8.__fds_bits[9] = 0;
          local_1b8.__fds_bits[10] = 0;
          local_1b8.__fds_bits[0xb] = 0;
          local_1b8.__fds_bits[0xc] = 0;
          local_1b8.__fds_bits[0xd] = 0;
          local_1b8.__fds_bits[0xe] = 0;
          local_1b8.__fds_bits[0xf] = 0;
          uVar1 = curl_multi_fdset(lVar4,&local_b8,&local_138,&local_1b8,&local_1d0);
          if (uVar1 != 0) {
            test_cold_11();
            goto LAB_00102968;
          }
          if (local_1d0 < -1) {
            __format = 
            "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
            uVar6 = 0x52;
            goto LAB_00102a30;
          }
          iVar2 = select_wrapper(local_1d0 + 1,&local_b8,&local_138,&local_1b8,&local_1c8);
          if (iVar2 == -1) {
            test_cold_13();
            uVar1 = 0x79;
            goto LAB_00102968;
          }
          tVar7 = tutil_tvnow();
          lVar5 = tutil_tvdiff(tVar7,tv_test_start);
          if (60000 < lVar5) {
            test_cold_12();
            goto LAB_00102a55;
          }
          local_1d0 = -99;
          local_1c8.tv_sec = 1;
          local_1c8.tv_usec = 0;
          uVar1 = curl_multi_perform(lVar4,&local_1cc);
        } while (uVar1 == 0);
      }
      __stream = _stderr;
      uVar6 = curl_multi_strerror((ulong)uVar1);
      fprintf(__stream,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib503.c"
              ,0x47,(ulong)uVar1,uVar6);
    }
    else {
      test_cold_9();
    }
  }
LAB_00102968:
  curl_multi_remove_handle(lVar4,lVar3);
  curl_multi_cleanup(lVar4);
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
LAB_00102988:
  return uVar1;
}

Assistant:

int test(char *URL)
{
  CURL *c = NULL;
  CURLM *m = NULL;
  int res = 0;
  int running;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  easy_init(c);

  easy_setopt(c, CURLOPT_PROXY, libtest_arg2); /* set in first.c */
  easy_setopt(c, CURLOPT_URL, URL);
  easy_setopt(c, CURLOPT_USERPWD, "test:ing");
  easy_setopt(c, CURLOPT_PROXYUSERPWD, "test:ing");
  easy_setopt(c, CURLOPT_HTTPPROXYTUNNEL, 1L);
  easy_setopt(c, CURLOPT_HEADER, 1L);
  easy_setopt(c, CURLOPT_VERBOSE, 1L);

  multi_init(m);

  multi_add_handle(m, c);

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PA */

  curl_multi_remove_handle(m, c);
  curl_multi_cleanup(m);
  curl_easy_cleanup(c);
  curl_global_cleanup();

  return res;
}